

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::multiply(DoubleAPFloat *this,DoubleAPFloat *RHS,roundingMode RM)

{
  bool bVar1;
  fltCategory fVar2;
  opStatus oVar3;
  opStatus oVar4;
  opStatus oVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  type pAVar9;
  undefined1 local_168 [8];
  APFloat U;
  APFloat W;
  APFloat V;
  APFloat Tau;
  undefined1 local_e0 [8];
  APFloat T;
  APFloat D;
  APFloat C;
  APFloat B;
  APFloat A;
  int Status;
  DoubleAPFloat *Out;
  DoubleAPFloat *LHS;
  roundingMode RM_local;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  fVar2 = getCategory(this);
  if (fVar2 == fcNaN) {
    operator=(this,this);
    return opOK;
  }
  fVar2 = getCategory(RHS);
  if (fVar2 == fcNaN) {
    operator=(this,RHS);
    return opOK;
  }
  fVar2 = getCategory(this);
  if (((fVar2 == fcZero) && (fVar2 = getCategory(RHS), fVar2 == fcInfinity)) ||
     ((fVar2 = getCategory(this), fVar2 == fcInfinity && (fVar2 = getCategory(RHS), fVar2 == fcZero)
      ))) {
    makeNaN(this,false,false,(APInt *)0x0);
  }
  else {
    fVar2 = getCategory(this);
    if ((fVar2 != fcZero) && (fVar2 = getCategory(this), fVar2 != fcInfinity)) {
      fVar2 = getCategory(RHS);
      if ((fVar2 == fcZero) || (fVar2 = getCategory(RHS), fVar2 == fcInfinity)) {
        operator=(this,RHS);
        return opOK;
      }
      fVar2 = getCategory(this);
      bVar1 = false;
      if (fVar2 == fcNormal) {
        fVar2 = getCategory(RHS);
        bVar1 = false;
        if (fVar2 == fcNormal) {
          bVar1 = true;
        }
      }
      if (bVar1) {
        pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,0);
        APFloat::APFloat((APFloat *)((long)&B.U + 0x10),pAVar9);
        pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,1);
        APFloat::APFloat((APFloat *)((long)&C.U + 0x10),pAVar9);
        pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&RHS->Floats,0);
        APFloat::APFloat((APFloat *)((long)&D.U + 0x10),pAVar9);
        pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&RHS->Floats,1);
        APFloat::APFloat((APFloat *)((long)&T.U + 0x10),pAVar9);
        APFloat::APFloat((APFloat *)local_e0,(APFloat *)((long)&B.U + 0x10));
        A.U._20_4_ = APFloat::multiply((APFloat *)local_e0,(APFloat *)((long)&D.U + 0x10),RM);
        bVar1 = APFloat::isFiniteNonZero((APFloat *)local_e0);
        if (bVar1) {
          APFloat::APFloat((APFloat *)((long)&V.U + 0x10),(APFloat *)((long)&B.U + 0x10));
          APFloat::changeSign((APFloat *)local_e0);
          oVar3 = APFloat::fusedMultiplyAdd
                            ((APFloat *)((long)&V.U + 0x10),(APFloat *)((long)&D.U + 0x10),
                             (APFloat *)local_e0,RM);
          APFloat::changeSign((APFloat *)local_e0);
          APFloat::APFloat((APFloat *)((long)&W.U + 0x10),(APFloat *)((long)&B.U + 0x10));
          oVar4 = APFloat::multiply((APFloat *)((long)&W.U + 0x10),(APFloat *)((long)&T.U + 0x10),RM
                                   );
          APFloat::APFloat((APFloat *)((long)&U.U + 0x10),(APFloat *)((long)&C.U + 0x10));
          oVar5 = APFloat::multiply((APFloat *)((long)&U.U + 0x10),(APFloat *)((long)&D.U + 0x10),RM
                                   );
          oVar6 = APFloat::add((APFloat *)((long)&W.U + 0x10),(APFloat *)((long)&U.U + 0x10),RM);
          oVar7 = APFloat::add((APFloat *)((long)&V.U + 0x10),(APFloat *)((long)&W.U + 0x10),RM);
          APFloat::~APFloat((APFloat *)((long)&U.U + 0x10));
          APFloat::~APFloat((APFloat *)((long)&W.U + 0x10));
          APFloat::APFloat((APFloat *)local_168,(APFloat *)local_e0);
          oVar8 = APFloat::add((APFloat *)local_168,(APFloat *)((long)&V.U + 0x10),RM);
          A.U._20_4_ = oVar8 | oVar7 | oVar6 | oVar5 | oVar4 | oVar3 | A.U._20_4_;
          pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                   operator[](&this->Floats,0);
          APFloat::operator=(pAVar9,(APFloat *)local_168);
          bVar1 = APFloat::isFinite((APFloat *)local_168);
          if (bVar1) {
            oVar3 = APFloat::subtract((APFloat *)local_e0,(APFloat *)local_168,RM);
            oVar4 = APFloat::add((APFloat *)local_e0,(APFloat *)((long)&V.U + 0x10),RM);
            A.U._20_4_ = oVar4 | oVar3 | A.U._20_4_;
            pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                     operator[](&this->Floats,1);
            APFloat::operator=(pAVar9,(APFloat *)local_e0);
          }
          else {
            pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                     operator[](&this->Floats,1);
            APFloat::makeZero(pAVar9,false);
          }
          APFloat::~APFloat((APFloat *)local_168);
          APFloat::~APFloat((APFloat *)((long)&V.U + 0x10));
        }
        else {
          pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                   operator[](&this->Floats,0);
          APFloat::operator=(pAVar9,(APFloat *)local_e0);
          pAVar9 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                   operator[](&this->Floats,1);
          APFloat::makeZero(pAVar9,false);
        }
        APFloat::~APFloat((APFloat *)local_e0);
        APFloat::~APFloat((APFloat *)((long)&T.U + 0x10));
        APFloat::~APFloat((APFloat *)((long)&D.U + 0x10));
        APFloat::~APFloat((APFloat *)((long)&C.U + 0x10));
        APFloat::~APFloat((APFloat *)((long)&B.U + 0x10));
        return A.U._20_4_;
      }
      __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal && \"Special cases not handled exhaustively\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xffc,
                    "APFloat::opStatus llvm::detail::DoubleAPFloat::multiply(const DoubleAPFloat &, APFloat::roundingMode)"
                   );
    }
    operator=(this,this);
  }
  return opOK;
}

Assistant:

APFloat::opStatus DoubleAPFloat::multiply(const DoubleAPFloat &RHS,
                                          APFloat::roundingMode RM) {
  const auto &LHS = *this;
  auto &Out = *this;
  /* Interesting observation: For special categories, finding the lowest
     common ancestor of the following layered graph gives the correct
     return category:

        NaN
       /   \
     Zero  Inf
       \   /
       Normal

     e.g. NaN * NaN = NaN
          Zero * Inf = NaN
          Normal * Zero = Zero
          Normal * Inf = Inf
  */
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if ((LHS.getCategory() == fcZero && RHS.getCategory() == fcInfinity) ||
      (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcZero)) {
    Out.makeNaN(false, false, nullptr);
    return opOK;
  }
  if (LHS.getCategory() == fcZero || LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero || RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal &&
         "Special cases not handled exhaustively");

  int Status = opOK;
  APFloat A = Floats[0], B = Floats[1], C = RHS.Floats[0], D = RHS.Floats[1];
  // t = a * c
  APFloat T = A;
  Status |= T.multiply(C, RM);
  if (!T.isFiniteNonZero()) {
    Floats[0] = T;
    Floats[1].makeZero(/* Neg = */ false);
    return (opStatus)Status;
  }

  // tau = fmsub(a, c, t), that is -fmadd(-a, c, t).
  APFloat Tau = A;
  T.changeSign();
  Status |= Tau.fusedMultiplyAdd(C, T, RM);
  T.changeSign();
  {
    // v = a * d
    APFloat V = A;
    Status |= V.multiply(D, RM);
    // w = b * c
    APFloat W = B;
    Status |= W.multiply(C, RM);
    Status |= V.add(W, RM);
    // tau += v + w
    Status |= Tau.add(V, RM);
  }
  // u = t + tau
  APFloat U = T;
  Status |= U.add(Tau, RM);

  Floats[0] = U;
  if (!U.isFinite()) {
    Floats[1].makeZero(/* Neg = */ false);
  } else {
    // Floats[1] = (t - u) + tau
    Status |= T.subtract(U, RM);
    Status |= T.add(Tau, RM);
    Floats[1] = T;
  }
  return (opStatus)Status;
}